

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool peparse::readCString(bounded_buffer *buffer,uint32_t off,string *result)

{
  uchar *__end;
  uchar *__beg;
  uchar *puVar1;
  
  if (off < buffer->bufLen) {
    __beg = buffer->buf + off;
    puVar1 = buffer->buf + buffer->bufLen;
    __end = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (__beg,puVar1);
    if (__end != puVar1) {
      std::__cxx11::string::insert<unsigned_char*,void>
                ((string *)result,
                 (const_iterator)((result->_M_dataplus)._M_p + result->_M_string_length),__beg,__end
                );
      return true;
    }
  }
  return false;
}

Assistant:

static bool
readCString(const bounded_buffer &buffer, std::uint32_t off, string &result) {
  if (off < buffer.bufLen) {
    std::uint8_t *p = buffer.buf;
    std::uint32_t n = buffer.bufLen;
    std::uint8_t *b = p + off;
    std::uint8_t *x = std::find(b, p + n, 0);

    if (x == p + n) {
      return false;
    }

    result.insert(result.end(), b, x);
    return true;
  }
  return false;
}